

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O0

pointer_type
cppcms::impl::
mfunc_to_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
          (offset_in_cgi_forwarder_to_subr f,
          shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *s)

{
  handler_binder_p0<void_(cppcms::impl::cgi::connection::cgi_forwarder::*)(),_std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>_>
  *in_RCX;
  shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *in_RDI;
  shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *p;
  
  p = in_RDI;
  operator_new(0x30);
  handler_binder_p0<void_(cppcms::impl::cgi::connection::cgi_forwarder::*)(),_std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>_>
  ::handler_binder_p0(in_RCX,(offset_in_cgi_forwarder_to_subr *)p,in_RDI);
  booster::intrusive_ptr<booster::callable<void_()>_>::intrusive_ptr
            ((intrusive_ptr<booster::callable<void_()>_> *)in_RCX,(callable<void_()> *)p,
             SUB81((ulong)in_RDI >> 0x38,0));
  return (pointer_type)(callable<void_()> *)p;
}

Assistant:

booster::aio::handler::pointer_type mfunc_to_handler(void (C::*f)(),S s)
{
	return new handler_binder_p0<void (C::*)(),S>(f,s);
}